

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

string * __thiscall
CScriptWitness::ToString_abi_cxx11_(string *__return_storage_ptr__,CScriptWitness *this)

{
  long lVar1;
  uchar *puVar2;
  pointer pvVar3;
  uint uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  string local_78;
  string ret;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ret,"CScriptWitness(",(allocator<char> *)&local_78);
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    pvVar3 = (this->stack).
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->stack).
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar3) / 0x18) <= uVar5)
    break;
    if (uVar5 != 0) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&ret,", ");
      pvVar3 = (this->stack).
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    puVar2 = *(uchar **)
              &pvVar3[uVar5].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl;
    s.m_size = (long)*(pointer *)
                      ((long)&pvVar3[uVar5].
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl + 8) - (long)puVar2;
    s.m_data = puVar2;
    HexStr_abi_cxx11_(&local_78,s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&ret,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    uVar4 = uVar4 + 1;
  }
  std::operator+(__return_storage_ptr__,&ret,")");
  std::__cxx11::string::~string((string *)&ret);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CScriptWitness::ToString() const
{
    std::string ret = "CScriptWitness(";
    for (unsigned int i = 0; i < stack.size(); i++) {
        if (i) {
            ret += ", ";
        }
        ret += HexStr(stack[i]);
    }
    return ret + ")";
}